

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O0

void __thiscall UTimer::UTimer(UTimer *this,string *m)

{
  rep rVar1;
  string *in_RSI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_RDI);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  rVar1 = std::chrono::_V2::system_clock::now();
  (in_RDI->__d).__r = rVar1;
  return;
}

Assistant:

UTimer::UTimer (const std::string m) : message(m) {
	start		= std::chrono::high_resolution_clock::now();
}